

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintpreviewwidget.cpp
# Opt level: O0

void __thiscall QPrintPreviewWidget::setViewMode(QPrintPreviewWidget *this,ViewMode mode)

{
  long lVar1;
  GraphicsView *pGVar2;
  int iVar3;
  int iVar4;
  QPrintPreviewWidgetPrivate *pQVar5;
  ViewMode in_ESI;
  long in_FS_OFFSET;
  qreal qVar6;
  QPrintPreviewWidgetPrivate *d;
  undefined1 local_78 [8];
  QPrintPreviewWidgetPrivate *in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffffb7;
  QPrintPreviewWidgetPrivate *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = d_func((QPrintPreviewWidget *)0x159ab4);
  pQVar5->viewMode = in_ESI;
  QPrintPreviewWidgetPrivate::layoutPages(in_stack_ffffffffffffff90);
  if (pQVar5->viewMode == AllPagesView) {
    pGVar2 = pQVar5->graphicsView;
    QGraphicsScene::itemsBoundingRect();
    QGraphicsView::fitInView((QRectF *)pGVar2,(AspectRatioMode)local_78);
    pQVar5->fitting = false;
    pQVar5->zoomMode = CustomZoom;
    QGraphicsView::transform();
    qVar6 = QTransform::m11((QTransform *)&stack0xffffffffffffffa8);
    iVar3 = QPaintDevice::logicalDpiY((QPaintDevice *)0x159b71);
    iVar4 = QPaintDevice::logicalDpiY((QPaintDevice *)0x159b89);
    pQVar5->zoomFactor = qVar6 * (double)((float)iVar3 / (float)iVar4);
    previewChanged((QPrintPreviewWidget *)0x159bbc);
  }
  else {
    pQVar5->fitting = true;
    QPrintPreviewWidgetPrivate::_q_fit(in_stack_ffffffffffffffb8,(bool)in_stack_ffffffffffffffb7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPrintPreviewWidget::setViewMode(ViewMode mode)
{
    Q_D(QPrintPreviewWidget);
    d->viewMode = mode;
    d->layoutPages();
    if (d->viewMode == AllPagesView) {
        d->graphicsView->fitInView(d->scene->itemsBoundingRect(), Qt::KeepAspectRatio);
        d->fitting = false;
        d->zoomMode = QPrintPreviewWidget::CustomZoom;
        d->zoomFactor = d->graphicsView->transform().m11() * (float(d->printer->logicalDpiY()) / logicalDpiY());
        emit previewChanged();
    } else {
        d->fitting = true;
        d->_q_fit();
    }
}